

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen.c
# Opt level: O3

int make_var_live(gen_ctx_t gen_ctx,MIR_reg_t var,int scan_var,int point,int insn_p)

{
  VARR_live_range_t *pVVar1;
  void *pvVar2;
  gen_ctx_t bm;
  bitmap_t pVVar3;
  void **ppvVar4;
  int iVar5;
  lr_ctx *plVar6;
  live_range_t_conflict plVar7;
  live_range_t_conflict plVar8;
  MIR_item_t pMVar9;
  int extraout_EDX;
  uint extraout_EDX_00;
  uint start;
  uint uVar10;
  size_t nb;
  size_t nb_00;
  gen_ctx_t gen_ctx_00;
  gen_ctx_t pgVar11;
  int iVar12;
  ulong uVar13;
  ulong uVar14;
  
  nb = (size_t)var;
  plVar6 = gen_ctx->lr_ctx;
  pVVar1 = plVar6->var_live_ranges;
  iVar12 = insn_p;
  if (((pVVar1 == (VARR_live_range_t *)0x0) || (pVVar1->varr == (live_range_t_conflict *)0x0)) ||
     (uVar14 = (ulong)var, pVVar1->els_num <= uVar14)) {
    make_var_live_cold_4();
LAB_0016da3f:
    make_var_live_cold_2();
    gen_ctx_00 = gen_ctx;
LAB_0016da44:
    make_var_live_cold_3();
  }
  else {
    plVar7 = pVVar1->varr[uVar14];
    if ((insn_p == 0) || (plVar6->scan_vars_num != 0)) {
LAB_0016d983:
      pgVar11 = (gen_ctx_t)plVar6->live_vars;
      uVar13 = (ulong)scan_var;
      nb = uVar13 + 1;
      gen_ctx_00 = pgVar11;
      bitmap_expand((bitmap_t)pgVar11,nb);
      if (pgVar11 != (gen_ctx_t)0x0) {
        iVar5 = 0;
        pvVar2 = (&pgVar11->curr_func_item->data)[uVar13 >> 6];
        (&pgVar11->curr_func_item->data)[uVar13 >> 6] =
             (void *)((ulong)pvVar2 | 1L << (uVar13 & 0x3f));
        if ((((ulong)pvVar2 >> (uVar13 & 0x3f) & 1) != 0) ||
           (((insn_p != 0 && (plVar7 != (live_range_t_conflict)0x0)) &&
            ((plVar7->lr_bb == (lr_bb_t_conflict)0x0 &&
             (iVar5 = 1, plVar7->finish + 1 == point || plVar7->finish == point)))))) {
          return iVar5;
        }
        nb = (size_t)(uint)point;
        pVVar1 = gen_ctx->lr_ctx->var_live_ranges;
        plVar7 = create_live_range(gen_ctx,point,-1,plVar7);
        if (((pVVar1 != (VARR_live_range_t *)0x0) && (pVVar1->varr != (live_range_t_conflict *)0x0))
           && (uVar14 < pVVar1->els_num)) {
          pVVar1->varr[uVar14] = plVar7;
          return 1;
        }
        goto LAB_0016da3f;
      }
      goto LAB_0016da44;
    }
    pgVar11 = (gen_ctx_t)plVar6->referenced_vars;
    nb = uVar14 + 1;
    gen_ctx_00 = pgVar11;
    bitmap_expand((bitmap_t)pgVar11,nb);
    if (pgVar11 != (gen_ctx_t)0x0) {
      ppvVar4 = &pgVar11->curr_func_item->data + (var >> 6);
      *ppvVar4 = (void *)((ulong)*ppvVar4 | 1L << (uVar14 & 0x3f));
      plVar6 = gen_ctx->lr_ctx;
      goto LAB_0016d983;
    }
  }
  make_var_live_cold_1();
  iVar5 = (int)nb;
  if (*(int *)((long)&gen_ctx_00->ctx + 4) == 0) {
    return iVar5;
  }
  if (iVar5 < 0) {
LAB_0016da80:
    __assert_fail("scan_var >= 0 && (int) (VARR_MIR_reg_tlength (gen_ctx->lr_ctx->scan_var_to_var_map)) > scan_var"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                  ,0x171b,"MIR_reg_t scan_var_to_var(gen_ctx_t, int)");
  }
  pMVar9 = gen_ctx_00->curr_func_item;
  if (pMVar9 == (MIR_item_t)0x0) {
    scan_var_to_var_cold_2();
  }
  else {
    ppvVar4 = &pMVar9->data;
    if ((int)*ppvVar4 <= iVar5) goto LAB_0016da80;
    pMVar9 = (pMVar9->item_link).prev;
    if ((pMVar9 != (MIR_item_t)0x0) && ((void *)(nb & 0xffffffff) < *ppvVar4)) {
      return *(int *)((long)&pMVar9->data + (long)(nb & 0xffffffff) * 4);
    }
  }
  scan_var_to_var_cold_1();
  uVar10 = (uint)nb;
  start = (uint)pMVar9;
  uVar14 = nb & 0xffffffff;
  pgVar11 = gen_ctx_00;
  if ((iVar12 != 0) && (gen_ctx_00->lr_ctx->scan_vars_num == 0)) {
    bm = (gen_ctx_t)gen_ctx_00->lr_ctx->referenced_vars;
    nb_00 = uVar14 + 1;
    pgVar11 = bm;
    bitmap_expand((bitmap_t)bm,nb_00);
    uVar10 = (uint)nb_00;
    if (bm == (gen_ctx_t)0x0) goto LAB_0016db94;
    pMVar9 = (MIR_item_t)(uVar14 >> 6);
    ppvVar4 = &bm->curr_func_item->data + (long)pMVar9;
    *ppvVar4 = (void *)((ulong)*ppvVar4 | 1L << (nb & 0x3f));
  }
  pVVar1 = gen_ctx_00->lr_ctx->var_live_ranges;
  if (((pVVar1 == (VARR_live_range_t *)0x0) ||
      (pMVar9 = (MIR_item_t)pVVar1->varr, pMVar9 == (MIR_item_t)0x0)) || (pVVar1->els_num <= uVar14)
     ) {
    make_var_dead_cold_4();
LAB_0016db8a:
    make_var_dead_cold_2();
  }
  else {
    pVVar3 = gen_ctx_00->lr_ctx->live_vars;
    if (pVVar3 != (bitmap_t)0x0) {
      plVar7 = (live_range_t_conflict)(&pMVar9->data)[uVar14];
      plVar8 = (live_range_t_conflict)(long)extraout_EDX;
      if ((plVar8 < (live_range_t_conflict)(pVVar3->els_num << 6)) &&
         (uVar13 = pVVar3->varr[(ulong)plVar8 >> 6],
         pVVar3->varr[(ulong)plVar8 >> 6] = uVar13 & ~(1L << ((ulong)plVar8 & 0x3f)),
         (uVar13 >> ((ulong)plVar8 & 0x3f) & 1) != 0)) {
        plVar7->finish = start;
LAB_0016db7c:
        return (int)plVar8;
      }
      uVar10 = start;
      plVar8 = create_live_range(gen_ctx_00,start,start,plVar7);
      pMVar9 = (MIR_item_t)pVVar1->varr;
      pgVar11 = gen_ctx_00;
      if ((pMVar9 != (MIR_item_t)0x0) && (uVar14 < pVVar1->els_num)) {
        (&pMVar9->data)[uVar14] = plVar8;
        goto LAB_0016db7c;
      }
      goto LAB_0016db8a;
    }
  }
  make_var_dead_cold_3();
LAB_0016db94:
  make_var_dead_cold_1();
  plVar7 = pgVar11->lr_ctx->free_lr_list;
  if (plVar7 == (live_range_t_conflict)0x0) {
    plVar7 = (live_range_t_conflict)gen_malloc(pgVar11,0x20);
  }
  else {
    pgVar11->lr_ctx->free_lr_list = plVar7->next;
  }
  if ((int)uVar10 < 0) {
    __assert_fail("start >= 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                  ,0x186d,"live_range_t create_live_range(gen_ctx_t, int, int, live_range_t)");
  }
  if (extraout_EDX_00 < uVar10) {
    __assert_fail("finish < 0 || start <= finish",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                  ,0x186e,"live_range_t create_live_range(gen_ctx_t, int, int, live_range_t)");
  }
  plVar7->start = uVar10;
  plVar7->finish = extraout_EDX_00;
  plVar7->ref_cost = 1;
  plVar7->next = (live_range_t)pMVar9;
  plVar7->lr_bb = (lr_bb_t_conflict)0x0;
  return (int)plVar7;
}

Assistant:

static inline int make_var_live (gen_ctx_t gen_ctx, MIR_reg_t var, int scan_var, int point,
                                 int insn_p) {
  live_range_t lr;
  lr = VARR_GET (live_range_t, var_live_ranges, var);
  if (insn_p && scan_vars_num == 0) bitmap_set_bit_p (referenced_vars, var);
  if (!bitmap_set_bit_p (live_vars, scan_var)) return FALSE;
  /* Always start new live range for starting living at bb end or if
     the last live range is covering a whole bb: */
  if (!insn_p || lr == NULL || lr->lr_bb != NULL
      || (lr->finish != point && lr->finish + 1 != point)) {
    VARR_SET (live_range_t, var_live_ranges, var, create_live_range (gen_ctx, point, -1, lr));
  }
  return TRUE;
}